

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O1

void __thiscall AST::ASTBuilder::handle(ASTBuilder *this,string *action,string *LHS)

{
  int iVar1;
  string action_number;
  string arg;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  if (this->isIgnoreModeOn == false) {
    std::__cxx11::string::substr((ulong)local_60,(ulong)action);
    iVar1 = std::__cxx11::string::compare((char *)local_60);
    if (iVar1 == 0) {
      if (action->_M_string_length < 3) {
        createNode(this,LHS);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_40,(ulong)action);
        createNode(this,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_60);
      if (iVar1 == 0) {
        insertRightChild(this);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_60);
        if (iVar1 == 0) {
          adoptChild(this);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_60);
          if (iVar1 == 0) {
            insertLeftChild(this);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_60);
            if (iVar1 == 0) {
              constructListAndInsertAsChild(this);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)local_60);
              if (iVar1 == 0) {
                std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back
                          (&(this->stack).c);
              }
              else {
                removeSelfIfOnlyHasOneChild(this);
              }
            }
          }
        }
      }
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  return;
}

Assistant:

void AST::ASTBuilder::handle(std::string &action, std::string &LHS) {
    if (isIgnoreModeOn) return;
    std::string action_number = action.substr(0, 2);
    if (action_number == "@1") {
        //Extract #optiona_custom_name for the AST node.
        if (action.size() > 2) {
            std::string arg = action.substr(4);
            createNode(arg);
        } else createNode(LHS);
    } else if (action_number == "@2") insertRightChild();
    else if (action_number == "@3") adoptChild();
    else if (action_number == "@4") insertLeftChild();
    else if (action_number == "@5") constructListAndInsertAsChild();
    else if (action_number == "@6") stack.pop();
    else removeSelfIfOnlyHasOneChild();
}